

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DeleteMessage.cpp
# Opt level: O0

void __thiscall DeleteMessage::DeleteMessage(DeleteMessage *this,char *directory)

{
  char *directory_local;
  DeleteMessage *this_local;
  
  ServerOperation::ServerOperation(&this->super_ServerOperation,directory);
  (this->super_ServerOperation)._vptr_ServerOperation = (_func_int **)&PTR_fillMe_0010ace0;
  std::__cxx11::string::string((string *)&this->username);
  this->parameter_count = 0;
  this->chosen_message = 0;
  std::__cxx11::string::operator=((string *)&this->username,"");
  std::__cxx11::string::operator=((string *)&(this->super_ServerOperation).statusMessage,"User:");
  return;
}

Assistant:

DeleteMessage::DeleteMessage(const char * directory) : ServerOperation(directory) {
    parameter_count = 0;
    chosen_message = 0;
    username = "";
    statusMessage = "User:";
}